

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt,int sort)

{
  int iVar1;
  xmlXPathContextPtr pxVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  
  pxVar2 = ctxt->context;
  if (pxVar2 != (xmlXPathContextPtr)0x0) {
    if (4999 < pxVar2->depth) {
      xmlXPathErr(ctxt,0x1a);
      return;
    }
    pxVar2->depth = pxVar2->depth + 10;
  }
  xmlXPathCompAndExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar4 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
    while ((pxVar3 = ctxt->cur, *pxVar3 == 'o' && (pxVar3[1] == 'r'))) {
      iVar1 = ctxt->comp->last;
      pbVar4 = pxVar3 + 2;
      while( true ) {
        ctxt->cur = pbVar4;
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        pbVar4 = pbVar4 + 1;
      }
      xmlXPathCompAndExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,iVar1,ctxt->comp->last,XPATH_OP_OR,0,0,0,(void *)0x0,(void *)0x0);
      pbVar4 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
      }
    }
    if ((sort != 0) && (iVar1 = ctxt->comp->last, ctxt->comp->steps[iVar1].op != XPATH_OP_VALUE)) {
      xmlXPathCompExprAdd(ctxt,iVar1,-1,XPATH_OP_SORT,0,0,0,(void *)0x0,(void *)0x0);
    }
    if (pxVar2 != (xmlXPathContextPtr)0x0) {
      pxVar2->depth = pxVar2->depth + -10;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt, int sort) {
    xmlXPathContextPtr xpctxt = ctxt->context;

    if (xpctxt != NULL) {
        if (xpctxt->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        /*
         * Parsing a single '(' pushes about 10 functions on the call stack
         * before recursing!
         */
        xpctxt->depth += 10;
    }

    xmlXPathCompAndExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'o') && (NXT(1) == 'r')) {
	int op1 = ctxt->comp->last;
        SKIP(2);
	SKIP_BLANKS;
        xmlXPathCompAndExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_OR, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
    if ((sort) && (ctxt->comp->steps[ctxt->comp->last].op != XPATH_OP_VALUE)) {
	/* more ops could be optimized too */
	/*
	* This is the main place to eliminate sorting for
	* operations which don't require a sorted node-set.
	* E.g. count().
	*/
	PUSH_UNARY_EXPR(XPATH_OP_SORT, ctxt->comp->last , 0, 0);
    }

    if (xpctxt != NULL)
        xpctxt->depth -= 10;
}